

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresbund.cpp
# Opt level: O2

ResourceData *
getFallbackData(UResourceBundle *resBundle,char **resTag,UResourceDataEntry **realData,Resource *res
               ,UErrorCode *status)

{
  char *__s1;
  Resource RVar1;
  int iVar2;
  char *__s2;
  UErrorCode UVar3;
  uint uVar4;
  UResourceDataEntry *pUVar5;
  UResourceDataEntry *pUVar6;
  bool bVar7;
  int32_t indexR;
  UResourceDataEntry **local_38;
  
  pUVar5 = resBundle->fData;
  indexR = -1;
  *res = 0xffffffff;
  if (pUVar5 != (UResourceDataEntry *)0x0) {
    bVar7 = pUVar5->fBogus == U_ZERO_ERROR;
    local_38 = realData;
    if (bVar7) {
      RVar1 = res_getTableItemByKey_63(&pUVar5->fData,(pUVar5->fData).rootRes,&indexR,resTag);
      *res = RVar1;
    }
    else {
      RVar1 = 0xffffffff;
    }
    uVar4 = (uint)bVar7;
    if (resBundle->fHasFallback == '\x01') {
      pUVar6 = pUVar5;
      uVar4 = (uint)bVar7;
      do {
        bVar7 = RVar1 == 0xffffffff;
        pUVar5 = pUVar6;
        do {
          if (!bVar7) goto LAB_002bad11;
          pUVar6 = pUVar5->fParent;
          if (pUVar6 == (UResourceDataEntry *)0x0) goto LAB_002bad0c;
          bVar7 = true;
          pUVar5 = pUVar6;
        } while (pUVar6->fBogus != U_ZERO_ERROR);
        uVar4 = uVar4 + 1;
        RVar1 = res_getTableItemByKey_63(&pUVar6->fData,(pUVar6->fData).rootRes,&indexR,resTag);
        *res = RVar1;
      } while( true );
    }
LAB_002bad0c:
    if (RVar1 != 0xffffffff) {
LAB_002bad11:
      if (1 < (int)uVar4) {
        __s1 = pUVar5->fName;
        __s2 = uloc_getDefault_63();
        iVar2 = strcmp(__s1,__s2);
        if (iVar2 == 0) {
          UVar3 = U_USING_DEFAULT_WARNING;
        }
        else {
          iVar2 = strcmp(pUVar5->fName,"root");
          UVar3 = (uint)(iVar2 == 0) | U_ERROR_WARNING_START;
        }
        *status = UVar3;
      }
      *local_38 = pUVar5;
      return &pUVar5->fData;
    }
  }
  *status = U_MISSING_RESOURCE_ERROR;
  return (ResourceData *)0x0;
}

Assistant:

static const ResourceData *getFallbackData(const UResourceBundle* resBundle, const char* * resTag, UResourceDataEntry* *realData, Resource *res, UErrorCode *status) {
    UResourceDataEntry *resB = resBundle->fData;
    int32_t indexR = -1;
    int32_t i = 0;
    *res = RES_BOGUS;
    if(resB != NULL) {
        if(resB->fBogus == U_ZERO_ERROR) { /* if this resource is real, */
            *res = res_getTableItemByKey(&(resB->fData), resB->fData.rootRes, &indexR, resTag); /* try to get data from there */
            i++;
        }
        if(resBundle->fHasFallback == TRUE) {
            while(*res == RES_BOGUS && resB->fParent != NULL) { /* Otherwise, we'll look in parents */
                resB = resB->fParent;
                if(resB->fBogus == U_ZERO_ERROR) {
                    i++;
                    *res = res_getTableItemByKey(&(resB->fData), resB->fData.rootRes, &indexR, resTag);
                }
            }
        }

        if(*res != RES_BOGUS) { /* If the resource is found in parents, we need to adjust the error */
            if(i>1) {
                if(uprv_strcmp(resB->fName, uloc_getDefault())==0 || uprv_strcmp(resB->fName, kRootLocaleName)==0) {
                    *status = U_USING_DEFAULT_WARNING;
                } else {
                    *status = U_USING_FALLBACK_WARNING;
                }
            }
            *realData = resB;
            return (&(resB->fData));
        } else { /* If resource is not found, we need to give an error */
            *status = U_MISSING_RESOURCE_ERROR;
            return NULL;
        }
    } else {
            *status = U_MISSING_RESOURCE_ERROR;
            return NULL;
    }
}